

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

type_info * pybind11::detail::get_type_info(PyTypeObject *type)

{
  undefined8 *puVar1;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var2;
  type_info *ptVar3;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar4;
  PyTypeObject *in_stack_00000008;
  
  pVar4 = all_type_info_get_cache(in_stack_00000008);
  _Var2 = pVar4.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (type,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                     *)((long)_Var2.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur + 0x10));
  }
  puVar1 = *(undefined8 **)
            ((long)_Var2.
                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                   ._M_cur + 0x10);
  if (puVar1 == *(undefined8 **)
                 ((long)_Var2.
                        super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                        ._M_cur + 0x18)) {
    ptVar3 = (type_info *)0x0;
  }
  else {
    if (8 < (ulong)((long)*(undefined8 **)
                           ((long)_Var2.
                                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                  ._M_cur + 0x18) - (long)puVar1)) {
      pybind11_fail("pybind11::detail::get_type_info: type has multiple pybind11-registered bases");
    }
    ptVar3 = (type_info *)*puVar1;
  }
  return ptVar3;
}

Assistant:

PYBIND11_NOINLINE detail::type_info *get_type_info(PyTypeObject *type) {
    const auto &bases = all_type_info(type);
    if (bases.empty()) {
        return nullptr;
    }
    if (bases.size() > 1) {
        pybind11_fail(
            "pybind11::detail::get_type_info: type has multiple pybind11-registered bases");
    }
    return bases.front();
}